

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  char *pcVar14;
  ulong unaff_R12;
  char *__s;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char format [7];
  char local_5b [7];
  uint local_54;
  long local_50;
  double local_48;
  size_t local_40;
  ulong local_38;
  
  local_48 = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x9c0,"empty buffer");
  }
  local_38 = (ulong)specs >> 0x20;
  uVar7 = 5;
  if (-1 < precision) {
    uVar7 = precision - 1;
  }
  bVar12 = specs._4_1_;
  uVar16 = (ulong)uVar7;
  if (1 < bVar12) {
    uVar16 = (ulong)(uint)precision;
  }
  local_5b[0] = '%';
  if (bVar12 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    pbVar8 = (byte *)(local_5b + 2);
    local_5b[1] = 0x23;
  }
  else {
    pbVar8 = (byte *)(local_5b + 1);
  }
  iVar15 = (int)uVar16;
  if (-1 < iVar15) {
    pbVar8[0] = 0x2e;
    pbVar8[1] = 0x2a;
    pbVar8 = pbVar8 + 2;
  }
  if (bVar12 == 3) {
    bVar9 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar9 = (bVar12 == 2) + 0x65;
  }
  *pbVar8 = bVar9;
  pbVar8[1] = 0;
  local_40 = buf->size_;
  local_50 = local_40 + 1;
  local_54 = (uint)bVar12;
  do {
    __s = buf->ptr_ + local_40;
    uVar11 = buf->capacity_ - local_40;
    if (iVar15 < 0) {
      uVar7 = snprintf(__s,uVar11,local_5b,local_48);
    }
    else {
      uVar7 = snprintf(__s,uVar11,local_5b,local_48,uVar16);
    }
    uVar17 = (ulong)uVar7;
    if ((int)uVar7 < 0) {
      bVar4 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_buffer)(buf,buf->capacity_ + 1);
      }
    }
    else if (uVar17 < uVar11) {
      if ((char)local_38 == '\x02') {
        if (iVar15 == 0) goto LAB_004d555f;
        unaff_R12 = 1;
        do {
          lVar5 = unaff_R12 + (uVar17 - 2);
          unaff_R12 = unaff_R12 - 1;
        } while ((byte)(__s[lVar5] - 0x30U) < 10);
        if (0 < (int)unaff_R12) {
LAB_004d56a4:
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        memmove(__s + unaff_R12 + uVar17 + -1,__s + unaff_R12 + uVar17,
                (ulong)(-(int)unaff_R12 & 0x7fffffff));
        uVar11 = (ulong)(uVar7 - 1);
        if (buf->capacity_ < uVar11) {
          (**buf->_vptr_buffer)(buf,uVar11);
        }
        if (buf->capacity_ < uVar11) {
          uVar11 = buf->capacity_;
        }
        buf->size_ = uVar11;
        bVar4 = false;
      }
      else if (local_54 == 3) {
        uVar17 = uVar17 + local_40;
LAB_004d555f:
        if (buf->capacity_ < uVar17) {
          (**buf->_vptr_buffer)(buf,uVar17);
        }
        if (buf->capacity_ < uVar17) {
          uVar17 = buf->capacity_;
        }
        buf->size_ = uVar17;
        bVar4 = false;
        unaff_R12 = 0;
      }
      else {
        uVar11 = 1;
        lVar5 = uVar17 - 2;
        lVar6 = 1;
        pcVar1 = __s;
        do {
          pcVar14 = pcVar1;
          lVar10 = lVar6;
          lVar18 = lVar5;
          uVar11 = uVar11 + 1;
          lVar5 = lVar18 + -1;
          lVar6 = lVar10 + -1;
          pcVar1 = pcVar14 + -1;
        } while (pcVar14[uVar17 - 1] != 'e');
        cVar2 = pcVar14[uVar17];
        if ((cVar2 != '+') && (cVar2 != '-')) {
          __assert_fail("sign == \'+\' || sign == \'-\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0xa0e,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                       );
        }
        iVar13 = 0;
        do {
          if (9 < (byte)(__s[lVar10 + uVar17] - 0x30U)) {
            __assert_fail("is_digit(*p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                          ,0xa12,
                          "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                         );
          }
          iVar13 = (uint)(byte)__s[lVar10 + uVar17] + iVar13 * 10 + -0x30;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
        iVar3 = -iVar13;
        if (cVar2 != '-') {
          iVar3 = iVar13;
        }
        uVar7 = 0;
        if (uVar17 != uVar11) {
          do {
            pcVar1 = __s + lVar18;
            lVar18 = lVar18 + -1;
          } while (*pcVar1 == '0');
          uVar7 = (uint)lVar18;
          if ((int)uVar7 < 0) goto LAB_004d56a4;
          memmove(__s + 1,__s + 2,(ulong)(uVar7 & 0x7fffffff));
        }
        uVar11 = (ulong)uVar7 + local_50;
        if (buf->capacity_ < uVar11) {
          (**buf->_vptr_buffer)(buf,uVar11);
        }
        if (buf->capacity_ < uVar11) {
          uVar11 = buf->capacity_;
        }
        buf->size_ = uVar11;
        unaff_R12 = (ulong)(iVar3 - uVar7);
        bVar4 = false;
      }
    }
    else {
      bVar4 = true;
      if (buf->capacity_ < uVar17 + local_50) {
        (**buf->_vptr_buffer)(buf,uVar17 + local_50);
      }
    }
    if (!bVar4) {
      return (int)unaff_R12;
    }
  } while( true );
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}